

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O3

string * __thiscall
cfd::js::api::json::
ExecuteElementsCheckApi<cfd::js::api::json::AppendDescriptorChecksumRequest,cfd::js::api::json::OutputDescriptorResponse,cfd::js::api::AppendDescriptorChecksumRequestStruct,cfd::js::api::OutputDescriptorResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::OutputDescriptorResponseStruct_(const_cfd::js::api::AppendDescriptorChecksumRequestStruct_&)>
          *bitcoin_function,
          function<cfd::js::api::OutputDescriptorResponseStruct_(const_cfd::js::api::AppendDescriptorChecksumRequestStruct_&)>
          *elements_function)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  string *psVar3;
  undefined8 uVar4;
  ErrorResponse res_1;
  OutputDescriptorResponse res;
  AppendDescriptorChecksumRequestStruct request;
  AppendDescriptorChecksumRequest req;
  undefined1 local_298 [40];
  _Alloc_hider local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  string local_1d0;
  undefined1 local_1b0 [16];
  undefined *local_1a0 [2];
  int local_190;
  _Alloc_hider local_188;
  undefined1 local_178 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  char local_158 [16];
  undefined1 local_148 [48];
  undefined1 auStack_118 [32];
  _Base_ptr p_Stack_f8;
  size_t local_f0;
  AppendDescriptorChecksumRequestStruct local_e8;
  AppendDescriptorChecksumRequest local_90;
  
  AppendDescriptorChecksumRequest::AppendDescriptorChecksumRequest(&local_90);
  core::JsonClassBase<cfd::js::api::json::AppendDescriptorChecksumRequest>::Deserialize
            (&local_90.super_JsonClassBase<cfd::js::api::json::AppendDescriptorChecksumRequest>,
             (string *)this);
  AppendDescriptorChecksumRequest::ConvertToStruct(&local_e8,&local_90);
  local_298._0_8_ = local_298 + 0x10;
  local_298._8_8_ = 0;
  local_298[0x10] = '\0';
  local_298._32_4_ = 0;
  local_270._M_p = (pointer)&local_260;
  local_268 = 0;
  local_260._M_local_buf[0] = '\0';
  local_250._M_p = (pointer)&local_240;
  local_248 = 0;
  local_240._M_local_buf[0] = '\0';
  p_Var1 = &local_230._M_impl.super__Rb_tree_header;
  local_230._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_230._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_230._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &local_200._M_impl.super__Rb_tree_header;
  local_200._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_200._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_200._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_230._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_230._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_200._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_200._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (local_e8.is_elements == true) {
    if ((bitcoin_function->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
LAB_005e859f:
      uVar4 = std::__throw_bad_function_call();
      OutputDescriptorResponse::~OutputDescriptorResponse((OutputDescriptorResponse *)local_1b0);
      psVar3 = (string *)(__return_storage_ptr__->_M_dataplus)._M_p;
      if (psVar3 != (string *)&local_270) {
        operator_delete(psVar3);
      }
      OutputDescriptorResponseStruct::~OutputDescriptorResponseStruct
                ((OutputDescriptorResponseStruct *)local_298);
      AppendDescriptorChecksumRequestStruct::~AppendDescriptorChecksumRequestStruct(&local_e8);
      AppendDescriptorChecksumRequest::~AppendDescriptorChecksumRequest(&local_90);
      _Unwind_Resume(uVar4);
    }
    (*bitcoin_function->_M_invoker)
              ((OutputDescriptorResponseStruct *)local_1b0,(_Any_data *)bitcoin_function,&local_e8);
  }
  else {
    if ((request_message->field_2)._M_allocated_capacity == 0) goto LAB_005e859f;
    (**(code **)((long)&request_message->field_2 + 8))(local_1b0,request_message,&local_e8);
  }
  std::__cxx11::string::operator=((string *)local_298,(string *)local_1b0);
  local_298._32_4_ = local_190;
  std::__cxx11::string::operator=((string *)&local_270,(string *)&local_188);
  std::__cxx11::string::operator=((string *)&local_250,(string *)(local_178 + 0x10));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_230);
  if ((_Base_ptr)local_148._16_8_ != (_Base_ptr)0x0) {
    local_230._M_impl.super__Rb_tree_header._M_header._M_color = local_148._8_4_;
    local_230._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_148._16_8_;
    local_230._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_148._24_8_;
    local_230._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_148._32_8_;
    *(_Rb_tree_header **)(local_148._16_8_ + 8) = p_Var1;
    local_230._M_impl.super__Rb_tree_header._M_node_count = local_148._40_8_;
    local_148._16_8_ = (_Base_ptr)0x0;
    local_148._40_8_ = 0;
    local_148._24_8_ = (_Base_ptr)(local_148 + 8);
    local_148._32_8_ = (_Base_ptr)(local_148 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_200);
  if ((_Base_ptr)auStack_118._16_8_ != (_Base_ptr)0x0) {
    local_200._M_impl.super__Rb_tree_header._M_header._M_color = auStack_118._8_4_;
    local_200._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)auStack_118._16_8_;
    local_200._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)auStack_118._24_8_;
    local_200._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_f8;
    *(_Rb_tree_header **)(auStack_118._16_8_ + 8) = p_Var2;
    local_200._M_impl.super__Rb_tree_header._M_node_count = local_f0;
    auStack_118._16_8_ = (_Base_ptr)0x0;
    local_f0 = 0;
    auStack_118._24_8_ = (_Base_ptr)(auStack_118 + 8);
    p_Stack_f8 = (_Base_ptr)(auStack_118 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_118);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_148);
  if ((char *)local_168._M_allocated_capacity != local_158) {
    operator_delete((void *)local_168._M_allocated_capacity);
  }
  if (local_188._M_p != local_178) {
    operator_delete(local_188._M_p);
  }
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (local_298._32_4_ == 0) {
    OutputDescriptorResponse::OutputDescriptorResponse((OutputDescriptorResponse *)local_1b0);
    OutputDescriptorResponse::ConvertFromStruct
              ((OutputDescriptorResponse *)local_1b0,(OutputDescriptorResponseStruct *)local_298);
    core::JsonClassBase<cfd::js::api::json::OutputDescriptorResponse>::Serialize_abi_cxx11_
              (&local_1d0,(JsonClassBase<cfd::js::api::json::OutputDescriptorResponse> *)local_1b0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    OutputDescriptorResponse::~OutputDescriptorResponse((OutputDescriptorResponse *)local_1b0);
  }
  else {
    ErrorResponse::ConvertFromStruct
              ((ErrorResponse *)local_1b0,(InnerErrorResponseStruct *)(local_298 + 0x20));
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
              (&local_1d0,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)local_1b0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    local_1b0._0_8_ = &PTR__ErrorResponseBase_00a78a38;
    InnerErrorResponse::~InnerErrorResponse((InnerErrorResponse *)local_178);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1b0 + 8));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_200);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_p != &local_240) {
    operator_delete(local_250._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_p != &local_260) {
    operator_delete(local_270._M_p);
  }
  if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
    operator_delete((void *)local_298._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_e8.ignore_items._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.descriptor._M_dataplus._M_p != &local_e8.descriptor.field_2) {
    operator_delete(local_e8.descriptor._M_dataplus._M_p);
  }
  AppendDescriptorChecksumRequest::~AppendDescriptorChecksumRequest(&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string ExecuteElementsCheckApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        bitcoin_function,  // NOLINT
    std::function<ResponseStructType(const RequestStructType &)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response;
  if (request.is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
    response = elements_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
  } else {
#ifndef CFD_DISABLE_BITCOIN
    response = bitcoin_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
  }
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}